

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_RF5C_Mem(VGMPlayer *this)

{
  UINT16 UVar1;
  CHIP_DEVICE *pCVar2;
  UINT16 memOfs;
  CHIP_DEVICE *cDev;
  UINT8 chipID;
  UINT8 chipType;
  VGMPlayer *this_local;
  
  pCVar2 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,'\0');
  if ((pCVar2 != (CHIP_DEVICE *)0x0) && (pCVar2->writeM8 != (DEVFUNC_WRITE_A16D8)0x0)) {
    UVar1 = ReadLE16(this->_fileData + (ulong)this->_filePos + 1);
    (*pCVar2->writeM8)((pCVar2->base).defInf.dataPtr,UVar1,
                       this->_fileData[(ulong)this->_filePos + 3]);
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_RF5C_Mem(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = 0;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->writeM8 == NULL)
		return;
	
	UINT16 memOfs = ReadLE16(&fData[0x01]);
	cDev->writeM8(cDev->base.defInf.dataPtr, memOfs, fData[0x03]);
	return;
}